

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_enum.c
# Opt level: O3

upb_MiniTableEnum *
upb_MtDecoder_BuildMiniTableEnum(upb_MdEnumDecoder *decoder,char *data,size_t len)

{
  byte bVar1;
  int iVar2;
  upb_MiniTableEnum *puVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  byte *pbVar8;
  char *pcVar9;
  byte *pbVar10;
  uint uVar11;
  
  iVar2 = _setjmp((__jmp_buf_tag *)(decoder->base).err);
  if (iVar2 == 0) {
    if (len != 0) {
      uVar7 = (uint)*data;
      if (uVar7 != 0x21) {
        pcVar9 = "Invalid enum version: %c";
LAB_0012c323:
        upb_MdDecoder_ErrorJmp(&decoder->base,pcVar9,(ulong)uVar7);
      }
      data = data + 1;
    }
    if (decoder->enum_table == (upb_MiniTableEnum *)0x0) {
      pcVar9 = "Out of memory";
LAB_0012c2f1:
      upb_MdDecoder_ErrorJmp(&decoder->base,pcVar9);
    }
    decoder->enum_table->mask_limit_dont_copy_me__upb_internal_use_only = 0x40;
    puVar3 = _upb_MiniTable_AddEnumDataMember(decoder,0);
    decoder->enum_table = puVar3;
    puVar3 = _upb_MiniTable_AddEnumDataMember(decoder,0);
    decoder->enum_table = puVar3;
    puVar3->value_count_dont_copy_me__upb_internal_use_only = 0;
    pbVar8 = (byte *)(decoder->base).end;
    if (data < pbVar8) {
      uVar4 = 0;
      do {
        bVar1 = *data;
        data = (char *)((byte *)data + 1);
        uVar7 = (uint)(char)bVar1;
        uVar6 = (long)(char)bVar1 & 0xffffffff;
        if ((long)(char)bVar1 < 0x42) {
          uVar7 = 0xffffffff;
          if (0xa0 < (byte)(bVar1 + 0x81)) {
            uVar7 = (uint)""[(int)(char)bVar1 - 0x20];
          }
          uVar6 = (ulong)uVar7;
          iVar2 = 0;
          do {
            uVar11 = (uint)uVar4;
            if ((uVar6 & 1) != 0) {
              puVar3 = decoder->enum_table;
              uVar7 = decoder->enum_value_count + 1;
              decoder->enum_value_count = uVar7;
              if (puVar3->value_count_dont_copy_me__upb_internal_use_only == 0) {
                uVar5 = puVar3->mask_limit_dont_copy_me__upb_internal_use_only;
                if ((uint)(uVar4 >> 5) <= uVar7 || uVar11 < 0x201) {
                  while (uVar5 < (uVar11 & 0xffffffe0) + 0x20) {
                    puVar3 = _upb_MiniTable_AddEnumDataMember(decoder,0);
                    uVar5 = puVar3->mask_limit_dont_copy_me__upb_internal_use_only + 0x20;
                    puVar3->mask_limit_dont_copy_me__upb_internal_use_only = uVar5;
                  }
                  (&puVar3[1].mask_limit_dont_copy_me__upb_internal_use_only)[uVar4 >> 5] =
                       (&puVar3[1].mask_limit_dont_copy_me__upb_internal_use_only)[uVar4 >> 5] |
                       1 << ((byte)uVar4 & 0x1f);
                  goto LAB_0012c1b6;
                }
                if (decoder->enum_data_count != uVar5 >> 5) {
                  __assert_fail("d->enum_data_count == table->mask_limit_dont_copy_me__upb_internal_use_only / 32"
                                ,
                                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/upb/mini_descriptor/build_enum.c"
                                ,0x38,
                                "void upb_MiniTableEnum_BuildValue(upb_MdEnumDecoder *, uint32_t)");
                }
              }
              puVar3 = _upb_MiniTable_AddEnumDataMember(decoder,uVar11);
              puVar3->value_count_dont_copy_me__upb_internal_use_only =
                   puVar3->value_count_dont_copy_me__upb_internal_use_only + 1;
            }
LAB_0012c1b6:
            iVar2 = iVar2 + 1;
            uVar11 = uVar11 + 1;
            uVar6 = uVar6 >> 1;
            uVar4 = (ulong)uVar11;
          } while (iVar2 != 5);
          pbVar8 = (byte *)(decoder->base).end;
        }
        else {
          if (0x1f < (byte)(bVar1 + 0xa1)) {
            pcVar9 = "Unexpected character: %c";
            goto LAB_0012c323;
          }
          for (uVar7 = 0x1f; 0x1eU >> uVar7 == 0; uVar7 = uVar7 - 1) {
          }
          uVar11 = 0;
          pbVar10 = (byte *)data;
          uVar5 = uVar11;
          while ((uVar11 = ""[((uint)uVar6 & 0xff) - 0x20] + -0x3c << ((byte)uVar5 & 0x1f) | uVar11,
                 data = (char *)pbVar8, pbVar10 != pbVar8 &&
                 (uVar6 = (ulong)*pbVar10, data = (char *)pbVar10, 0xdf < (byte)(*pbVar10 + 0x81))))
          {
            pbVar10 = pbVar10 + 1;
            uVar5 = uVar5 + (uVar7 ^ 0xffffffe0) + 0x21;
            if (0x1f < uVar5) {
              pcVar9 = "Overlong varint";
              goto LAB_0012c2f1;
            }
          }
          uVar11 = uVar11 + (int)uVar4;
        }
        uVar4 = (ulong)uVar11;
      } while (data < pbVar8);
      puVar3 = decoder->enum_table;
    }
  }
  else {
    puVar3 = (upb_MiniTableEnum *)0x0;
  }
  return puVar3;
}

Assistant:

static upb_MiniTableEnum* upb_MtDecoder_BuildMiniTableEnum(
    upb_MdEnumDecoder* const decoder, const char* const data,
    size_t const len) {
  if (UPB_SETJMP(decoder->base.err) != 0) return NULL;
  return upb_MtDecoder_DoBuildMiniTableEnum(decoder, data, len);
}